

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_util.h
# Opt level: O0

void webrtc::DownmixInterleavedToMonoImpl<short,int>
               (short *interleaved,size_t num_frames,int num_channels,short *deinterleaved)

{
  ulong uVar1;
  ulong uVar2;
  int local_354;
  int value;
  short *frame_end;
  short *end;
  uint local_1c4;
  string *local_1c0;
  string *_result_1;
  FatalMessage local_1a8;
  string *local_30;
  string *_result;
  short *deinterleaved_local;
  size_t sStack_18;
  int num_channels_local;
  size_t num_frames_local;
  short *interleaved_local;
  
  _result = (string *)deinterleaved;
  deinterleaved_local._4_4_ = num_channels;
  sStack_18 = num_frames;
  num_frames_local = (size_t)interleaved;
  local_30 = rtc::CheckGTImpl_abi_cxx11_(num_channels,0,"num_channels > 0");
  if (local_30 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/include/audio_util.h"
               ,0x9c,local_30);
    rtc::FatalMessage::stream(&local_1a8);
    rtc::FatalMessage::~FatalMessage(&local_1a8);
  }
  local_1c4 = 0;
  local_1c0 = rtc::CheckGTImpl<unsigned_long,unsigned_int>
                        (&stack0xffffffffffffffe8,&local_1c4,"num_frames > 0u");
  if (local_1c0 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              ((FatalMessage *)&end,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/include/audio_util.h"
               ,0x9d,local_1c0);
    rtc::FatalMessage::stream((FatalMessage *)&end);
    rtc::FatalMessage::~FatalMessage((FatalMessage *)&end);
  }
  uVar1 = num_frames_local + sStack_18 * (long)deinterleaved_local._4_4_ * 2;
  while (num_frames_local < uVar1) {
    uVar2 = num_frames_local + (long)deinterleaved_local._4_4_ * 2;
    local_354 = (int)*(short *)num_frames_local;
    while (num_frames_local = num_frames_local + 2, num_frames_local < uVar2) {
      local_354 = *(short *)num_frames_local + local_354;
    }
    *(short *)_result = (short)(local_354 / deinterleaved_local._4_4_);
    _result = _result + 2;
  }
  return;
}

Assistant:

void DownmixInterleavedToMonoImpl(const T* interleaved,
                                  size_t num_frames,
                                  int num_channels,
                                  T* deinterleaved) {
  RTC_DCHECK_GT(num_channels, 0);
  RTC_DCHECK_GT(num_frames, 0u);

  const T* const end = interleaved + num_frames * num_channels;

  while (interleaved < end) {
    const T* const frame_end = interleaved + num_channels;

    Intermediate value = *interleaved++;
    while (interleaved < frame_end) {
      value += *interleaved++;
    }

    *deinterleaved++ = value / num_channels;
  }
}